

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vminit.cpp
# Opt level: O3

void vm_init_base(vm_globals **vmg,vm_init_options *opts)

{
  uint *puVar1;
  int iVar2;
  undefined4 extraout_var;
  FILE *__stream;
  CVmVarHeapHybrid *this_00;
  CVmMemory *this_01;
  CVmUndo *this_02;
  CVmMetaTable *this_03;
  CVmBifTable *this_04;
  CVmTimeZoneCache *this_05;
  CVmSrcfTable *this_06;
  CVmBifTADSGlobals *this_07;
  undefined4 extraout_var_00;
  char *__format;
  EVP_PKEY_CTX *pEVar3;
  char *mapname;
  bool bVar4;
  bool bVar5;
  char filecont_mapname [32];
  char filename_mapname [32];
  char disp_mapname [32];
  char buf [256];
  char path [4096];
  char local_1198 [32];
  char local_1178 [32];
  char local_1158 [32];
  char local_1138 [256];
  char local_1038 [4104];
  CResLoader *this;
  
  *vmg = (vm_globals *)0x0;
  err_init(0x400);
  iVar2 = (*opts->hostifc->_vptr_CVmHostIfc[7])();
  this = (CResLoader *)CONCAT44(extraout_var,iVar2);
  iVar2 = err_is_message_file_loaded();
  if (this != (CResLoader *)0x0 && iVar2 == 0) {
    __stream = (FILE *)CResLoader::open_res_file(this,"T3_VM.msg",(char *)0x0,"XMSG");
    if (__stream != (FILE *)0x0) {
      err_load_message_file
                ((osfildef *)__stream,&vm_messages,&vm_message_count,vm_messages_english,
                 vm_message_count_english);
      fclose(__stream);
    }
  }
  G_host_ifc_X = opts->hostifc;
  (*G_host_ifc_X->_vptr_CVmHostIfc[0x12])(G_host_ifc_X,local_1038,0x1000,7);
  pEVar3 = (EVP_PKEY_CTX *)0x1000;
  os_build_full_path(G_syslogfile_X,0x1000,local_1038,"tadslog.txt");
  CVmObjTable::init(&G_obj_table_X,pEVar3);
  this_00 = (CVmVarHeapHybrid *)operator_new(0x30);
  CVmVarHeapHybrid::CVmVarHeapHybrid(this_00,&G_obj_table_X);
  G_varheap_X = (CVmVarHeap *)this_00;
  this_01 = (CVmMemory *)operator_new(0x10);
  CVmMemory::CVmMemory(this_01,(CVmVarHeap *)this_00);
  G_mem_X = this_01;
  this_02 = (CVmUndo *)operator_new(0x38);
  CVmUndo::CVmUndo(this_02,0x1000,0x40);
  G_undo_X = this_02;
  this_03 = (CVmMetaTable *)operator_new(0x20);
  CVmMetaTable::CVmMetaTable(this_03,5);
  G_meta_table_X = this_03;
  this_04 = (CVmBifTable *)operator_new(0x20);
  pEVar3 = (EVP_PKEY_CTX *)0x5;
  CVmBifTable::CVmBifTable(this_04,5);
  G_bif_table_X = this_04;
  this_05 = (CVmTimeZoneCache *)operator_new(0x50);
  CVmTimeZoneCache::CVmTimeZoneCache(this_05);
  G_tzcache_X = this_05;
  vm_register_metaclasses();
  CVmObjTads::class_init();
  CVmRun::init(&G_interpreter_X,pEVar3);
  G_debugger_X = (CVmDebug *)0x0;
  G_srcf_table_X = (CVmSrcfTable *)0x0;
  G_net_config_X = (TadsNetConfig *)0x0;
  vm_init_debugger();
  this_06 = (CVmSrcfTable *)operator_new(0x18);
  CVmSrcfTable::CVmSrcfTable(this_06);
  G_predef_X.rterr = 0;
  G_predef_X.rterrmsg_prop = 0;
  G_predef_X.obj_construct = 0;
  G_predef_X.obj_destruct = 0;
  G_predef_X.last_prop = 0;
  G_predef_X.obj_call_prop = 0;
  G_predef_X.prop_not_defined_prop = 0;
  G_predef_X.stack_info_cls._0_2_ = 0;
  G_predef_X._18_8_ = 0;
  G_predef_X.const_str_obj = 0;
  G_predef_X.const_lst_obj = 0;
  G_predef_X.last_prop_obj = 0;
  G_predef_X.storage_server_error = 0;
  G_predef_X.string_sth_flags = 0;
  G_predef_X.string_sth_tag = 0;
  G_predef_X.gramprod_first_tok = 0;
  G_predef_X.gramprod_last_tok = 0;
  G_predef_X.gramprod_token_list = 0;
  G_predef_X.gramprod_token_match_list = 0;
  G_predef_X.gramprod_tag = 0;
  G_predef_X.misc_vocab = 0;
  G_predef_X.gramprod_alt_props = 0;
  G_predef_X.gramprod_gram_alt_info = 0;
  G_predef_X.gramprod_gram_alt_tok_info = 0;
  G_predef_X.charset_unknown_exc = 0;
  G_predef_X.file_not_found_exc = 0;
  G_predef_X.file_creation_exc = 0;
  G_predef_X.file_open_exc = 0;
  G_predef_X.file_io_exc = 0;
  G_predef_X.file_sync_exc = 0;
  G_predef_X.file_closed_exc = 0;
  G_predef_X.file_mode_exc = 0;
  G_predef_X.file_safety_exc = 0;
  G_predef_X.filespec_getFilename = 0;
  G_predef_X.filespec_closeFile = 0;
  G_predef_X.file_info = 0;
  G_predef_X.compiler_exc = 0;
  G_predef_X.calc_hash_prop = 0;
  G_predef_X.match_values_prop = 0;
  G_predef_X.operator_add = 0;
  G_predef_X.operator_sub = 0;
  G_predef_X.operator_mul = 0;
  G_predef_X.operator_div = 0;
  G_predef_X.operator_mod = 0;
  G_predef_X.operator_xor = 0;
  G_predef_X.operator_shl = 0;
  G_predef_X.operator_ashr = 0;
  G_predef_X.operator_lshr = 0;
  G_predef_X.operator_bit_not = 0;
  G_predef_X.operator_bit_and = 0;
  G_predef_X.operator_bit_or = 0;
  G_predef_X.operator_neg = 0;
  G_predef_X.operator_idx = 0;
  G_predef_X.operator_setidx = 0;
  G_predef_X.net_exception = 0;
  G_predef_X.net_reset_exception = 0;
  G_predef_X.net_safety_exception = 0;
  G_predef_X.net_event = 0;
  G_predef_X.net_request_event = 0;
  G_predef_X.net_timeout_event = 0;
  G_predef_X.net_reply_event._0_2_ = 0;
  G_predef_X._182_6_ = 0;
  G_predef_X.file_upload_cl._0_2_ = 0;
  G_predef_X._190_8_ = 0;
  G_predef_X.reflection_services = 0;
  G_predef_X.reflection_valToSymbol = 0;
  G_predef_X.objToString = 0;
  G_preinit_mode_X = 0;
  G_srcf_table_X = this_06;
  this_07 = (CVmBifTADSGlobals *)operator_new(0x30);
  CVmBifTADSGlobals::CVmBifTADSGlobals(this_07);
  G_bif_tads_globals_X = this_07;
  CVmObjBigNum::init_cache();
  G_image_loader_X = (CVmImageLoader *)0x0;
  mapname = opts->charset;
  if (mapname == (char *)0x0) {
    mapname = local_1158;
    os_get_charmap(mapname,1);
    G_disp_cset_name_X = (char *)0x0;
  }
  else {
    G_disp_cset_name_X = lib_copy_str(mapname);
  }
  G_cmap_from_ui_X = CCharmapToUni::load(this,mapname);
  G_cmap_to_ui_X = CCharmapToLocal::load(this,mapname);
  os_get_charmap(local_1178,2);
  G_cmap_from_fname_X = CCharmapToUni::load(this,local_1178);
  G_cmap_to_fname_X = CCharmapToLocal::load(this,local_1178);
  os_get_charmap(local_1198,3);
  G_cmap_from_file_X = CCharmapToUni::load(this,local_1198);
  G_cmap_to_file_X = CCharmapToLocal::load(this,local_1198);
  if (opts->log_charset == (char *)0x0) {
    G_cmap_to_log_X = G_cmap_to_file_X;
    if (G_cmap_to_file_X != (CCharmapToLocal *)0x0) {
      puVar1 = &(G_cmap_to_file_X->super_CCharmap).ref_cnt_;
      *puVar1 = *puVar1 + 1;
    }
  }
  else {
    G_cmap_to_log_X = CCharmapToLocal::load(this,opts->log_charset);
  }
  bVar4 = G_cmap_from_ui_X == (CCharmapToUni *)0x0;
  bVar5 = G_cmap_to_ui_X == (CCharmapToLocal *)0x0;
  if (G_cmap_from_ui_X == (CCharmapToUni *)0x0) {
    G_cmap_from_ui_X = CCharmapToUni::load(this,"us-ascii");
  }
  if (G_cmap_to_ui_X == (CCharmapToLocal *)0x0) {
    G_cmap_to_ui_X = CCharmapToLocal::load(this,"us-ascii");
  }
  if (G_cmap_from_fname_X == (CCharmapToUni *)0x0) {
    G_cmap_from_fname_X = CCharmapToUni::load(this,"us-ascii");
  }
  if (G_cmap_to_fname_X == (CCharmapToLocal *)0x0) {
    G_cmap_to_fname_X = CCharmapToLocal::load(this,"us-ascii");
  }
  if (G_cmap_from_file_X == (CCharmapToUni *)0x0) {
    G_cmap_from_file_X = CCharmapToUni::load(this,"us-ascii");
  }
  if (G_cmap_to_file_X == (CCharmapToLocal *)0x0) {
    G_cmap_to_file_X = CCharmapToLocal::load(this,"us-ascii");
  }
  if (G_cmap_to_log_X == (CCharmapToLocal *)0x0) {
    G_cmap_to_log_X = CCharmapToLocal::load(this,"us-ascii");
  }
  iVar2 = (*opts->clientifc->_vptr_CVmMainClientIfc[3])(opts->clientifc,0);
  G_console_X = (CVmConsoleMain *)CONCAT44(extraout_var_00,iVar2);
  if (bVar4 || bVar5) {
    __format = err_get_msg(vm_messages,vm_message_count,0x906,1);
    sprintf(local_1138,__format,mapname);
    (*opts->clientifc->_vptr_CVmMainClientIfc[10])(opts->clientifc,0,0,local_1138,1);
  }
  return;
}

Assistant:

void vm_init_base(vm_globals **vmg, const vm_init_options *opts)
{
    /* 
     *   Allocate globals according to build-time configuration, then
     *   assign the global pointer to a local named vmg__.  This will
     *   ensure that the globals are accessible for all of the different
     *   build-time configurations.  
     */
    vm_globals *vmg__ = *vmg = vmglob_alloc();

    /* 
     *   in configurations where globals aren't passed as parameters, vmg__
     *   will never be referenced; explicitly reference it so that the
     *   compiler knows the assignment above is intentional even if it's not
     *   ever used in this particular build configuration
     */
    (void)vmg__;

    /* initialize the error stack */
    err_init(VM_ERR_STACK_BYTES);

    /* get the system resource loader from the host interface */
    CResLoader *map_loader = opts->hostifc->get_sys_res_loader();

    /* if an external message set hasn't been loaded, try loading one */
    if (!err_is_message_file_loaded() && map_loader != 0)
    {
        /* try finding a message file */
        osfildef *fp = map_loader->open_res_file(
            VM_ERR_MSG_FNAME, 0, VM_ERR_MSG_RESTYPE);
        if (fp != 0)
        {
            /* 
             *   try loading it - if that fails, we'll just be left with
             *   the built-in messages, so we won't have lost anything for
             *   trying 
             */
            err_load_vm_message_file(fp);
            
            /* we're done with the file */
            osfcls(fp);
        }
    }

    /* remember the host interface */
    G_host_ifc = opts->hostifc;

    /* initialize the system debug log file name */
    char path[OSFNMAX];
    opts->hostifc->get_special_file_path(path, sizeof(path), OS_GSP_LOGFILE);
    os_build_full_path(G_syslogfile, sizeof(G_syslogfile),
                       path, "tadslog.txt");

    /* create the object table */
    VM_IF_ALLOC_PRE_GLOBAL(G_obj_table = new CVmObjTable());
    G_obj_table->init(vmg0_);

    /* 
     *   Create the memory manager.  Empirically, our hybrid heap allocator
     *   is faster than the standard C++ run-time library's allocator on many
     *   platforms, so use it instead of hte basic 'malloc' allocator. 
     */
    G_varheap = new CVmVarHeapHybrid(G_obj_table);
    // G_varheap = new CVmVarHeapMalloc(); to use the system 'malloc' instead
    G_mem = new CVmMemory(vmg_ G_varheap);

    /* create the undo manager */
    G_undo = new CVmUndo(VM_UNDO_MAX_RECORDS, VM_UNDO_MAX_SAVEPTS);

    /* create the metafile and function set tables */
    G_meta_table = new CVmMetaTable(5);
    G_bif_table = new CVmBifTable(5);

    /* create the time zone cache */
    G_tzcache = new CVmTimeZoneCache();

    /* initialize the metaclass registration tables */
    vm_register_metaclasses();

    /* initialize the TadsObject class */
    CVmObjTads::class_init(vmg0_);

    /* create the byte-code interpreter */
    VM_IFELSE_ALLOC_PRE_GLOBAL(
        G_interpreter = new CVmRun(VM_STACK_SIZE, vm_init_stack_reserve()),
        G_interpreter->init());

    /* presume we won't create debugger information */
    G_debugger = 0;
    G_srcf_table = 0;

    /* presume we don't have a network configuration */
    G_net_config = 0;

    /* initialize the debugger if present */
    vm_init_debugger(vmg0_);

    /* create the source file table */
    G_srcf_table = new CVmSrcfTable();

    /* create the pre-defined object mapper */
    VM_IFELSE_ALLOC_PRE_GLOBAL(G_predef = new CVmPredef, G_predef->reset());

    /* presume we're in normal execution mode (not preinit) */
    G_preinit_mode = FALSE;

    /* allocate the TADS intrinsic function set's globals */
    G_bif_tads_globals = new CVmBifTADSGlobals(vmg0_);

    /* allocate the BigNumber register cache */
    CVmObjBigNum::init_cache();

    /* no image loader yet */
    G_image_loader = 0;

    /*
     *   If the caller explicitly specified a character set, use it.
     *   Otherwise, ask the OS layer for the default character set we
     *   should use. 
     */
    char disp_mapname[32];
    const char *charset = opts->charset;
    if (charset == 0)
    {
        /* the user did not specify a mapping - ask the OS for the default */
        os_get_charmap(disp_mapname, OS_CHARMAP_DISPLAY);

        /* use the name we got from the OS */
        charset = disp_mapname;

        /* there's no explicit global character set name setting to store */
        G_disp_cset_name = 0;
    }
    else
    {
        /* save the global character set name */
        G_disp_cset_name = lib_copy_str(charset);
    }

    /* create the display character maps */
    G_cmap_from_ui = CCharmapToUni::load(map_loader, charset);
    G_cmap_to_ui = CCharmapToLocal::load(map_loader, charset);

    /* create the filename character maps */
    char filename_mapname[32];
    os_get_charmap(filename_mapname, OS_CHARMAP_FILENAME);
    G_cmap_from_fname = CCharmapToUni::load(map_loader, filename_mapname);
    G_cmap_to_fname = CCharmapToLocal::load(map_loader, filename_mapname);

    /* create the file-contents character maps */
    char filecont_mapname[32];
    os_get_charmap(filecont_mapname, OS_CHARMAP_FILECONTENTS);
    G_cmap_from_file = CCharmapToUni::load(map_loader, filecont_mapname);
    G_cmap_to_file = CCharmapToLocal::load(map_loader, filecont_mapname);

    /* 
     *   If the caller specified a separate log-file character set, create
     *   the mapping.  Otherwise, just use the to-file mapper for log files.
     */
    if (opts->log_charset != 0)
    {
        /* load the specified log file output mapping */
        G_cmap_to_log = CCharmapToLocal::load(map_loader, opts->log_charset);
    }
    else
    {
        /* no log file mapping is specified, so use the generic file map */
        if ((G_cmap_to_log = G_cmap_to_file) != 0)
            G_cmap_to_log->add_ref();
    }

    /* make a note of whether we had any problems loading the maps */
    int disp_map_err = (G_cmap_from_ui == 0 || G_cmap_to_ui == 0);

    /* if we failed to create any of the maps, load defaults */
    if (G_cmap_from_ui == 0)
        G_cmap_from_ui = CCharmapToUni::load(map_loader, "us-ascii");
    if (G_cmap_to_ui == 0)
        G_cmap_to_ui = CCharmapToLocal::load(map_loader, "us-ascii");
    if (G_cmap_from_fname == 0)
        G_cmap_from_fname = CCharmapToUni::load(map_loader, "us-ascii");
    if (G_cmap_to_fname == 0)
        G_cmap_to_fname = CCharmapToLocal::load(map_loader, "us-ascii");
    if (G_cmap_from_file == 0)
        G_cmap_from_file = CCharmapToUni::load(map_loader, "us-ascii");
    if (G_cmap_to_file == 0)
        G_cmap_to_file = CCharmapToLocal::load(map_loader, "us-ascii");
    if (G_cmap_to_log == 0)
        G_cmap_to_log = CCharmapToLocal::load(map_loader, "us-ascii");

    /* create the primary console */
    G_console = opts->clientifc->create_console(VMGLOB_ADDR);

    /* 
     *   if we had any trouble opening the display character mapping file,
     *   make a note that we are using a default mapping 
     */
    if (disp_map_err)
    {
        const char *msg;
        char buf[256];

        /* get the message */
        msg = err_get_msg(vm_messages, vm_message_count,
                          VMERR_NO_CHARMAP_FILE, TRUE);

        /* format it */
        sprintf(buf, msg, charset);

        /* display it */
        opts->clientifc->display_error(VMGLOB_ADDR, 0, buf, TRUE);
    }
}